

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O0

int64_t duckdb::Date::EpochMicroseconds(date_t date)

{
  bool bVar1;
  undefined8 uVar2;
  int in_EDI;
  date_t in_stack_0000001c;
  int64_t result;
  allocator local_31;
  string local_30 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  ConversionException *in_stack_fffffffffffffff0;
  
  bVar1 = TryMultiplyOperator::Operation<long,_long,_long>
                    ((long)in_EDI,86400000000,(int64_t *)&stack0xfffffffffffffff0);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_30,"Could not convert DATE (%s) to microseconds",&local_31)
    ;
    ToString(in_stack_0000001c);
    ConversionException::
    ConversionException<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    __cxa_throw(uVar2,&ConversionException::typeinfo,ConversionException::~ConversionException);
  }
  return (int64_t)in_stack_fffffffffffffff0;
}

Assistant:

int64_t Date::EpochMicroseconds(date_t date) {
	int64_t result;
	if (!TryMultiplyOperator::Operation<int64_t, int64_t, int64_t>(date.days, Interval::MICROS_PER_DAY, result)) {
		throw ConversionException("Could not convert DATE (%s) to microseconds", Date::ToString(date));
	}
	return result;
}